

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_unique_ptr.cpp
# Opt level: O1

int main(void)

{
  long *plVar1;
  unique_ptr<int,_std::default_delete<int>_> uptr;
  shared_ptr<TestB> ptr_b;
  shared_ptr<TestA> ptr_a;
  shared_ptr<int> sptr;
  shared_ptr<int> sptr2;
  _Head_base<0UL,_int_*,_false> local_80;
  _Head_base<0UL,_int_*,_false> local_78;
  TestB *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  TestA *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  int *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  int *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  TestA *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  element_type *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_60 = (TestA *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<TestA,std::allocator<TestA>>
            (&local_58,&local_60,(allocator<TestA> *)&local_70);
  local_70 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<TestB,std::allocator<TestB>>
            (&local_68,&local_70,(allocator<TestB> *)&local_50);
  local_20 = local_70;
  local_18._M_pi = local_68._M_pi;
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
    }
  }
  (local_60->m_TestB_Ptr).super___shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_70;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(local_60->m_TestB_Ptr).super___shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_18);
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
  }
  local_30 = local_60;
  local_28._M_pi = local_58._M_pi;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
    }
  }
  (local_70->m_TestA_Ptr).super___shared_ptr<TestA,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(local_70->m_TestA_Ptr).super___shared_ptr<TestA,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_28);
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  local_78._M_head_impl = (int *)operator_new(4);
  *local_78._M_head_impl = 100;
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,std::default_delete<int>,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             (unique_ptr<int,_std::default_delete<int>_> *)&local_78);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Smart Ptr test: ",0x10);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,*local_50);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  local_80._M_head_impl = (int *)operator_new(4);
  *local_80._M_head_impl = 200;
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,std::default_delete<int>,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (unique_ptr<int,_std::default_delete<int>_> *)&local_80);
  if (local_80._M_head_impl != (int *)0x0) {
    operator_delete(local_80._M_head_impl,4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Smart Ptr test: ",0x10);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,*local_40);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_78._M_head_impl != (int *)0x0) {
    operator_delete(local_78._M_head_impl,4);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  return 0;
}

Assistant:

int main()
{
	std::shared_ptr<TestA> ptr_a = std::make_shared<TestA>();
	std::shared_ptr<TestB> ptr_b = std::make_shared<TestB>();
	ptr_a->ReferTestB(ptr_b);
	ptr_b->ReferTestB(ptr_a);

	// std::unique_ptr<int> uptr(new int(100));
	std::unique_ptr<int> uptr = std::make_unique<int>(100); // C++14
	std::shared_ptr<int> sptr = std::move(uptr);
	// sptr = std::move(uptr);
	std::cout << "Smart Ptr test: " << *sptr << std::endl;

	// return local unique_ptr
	std::shared_ptr<int> sptr2 = smart_ptr_factory();
	std::cout << "Smart Ptr test: " << *sptr2 << std::endl;


	return 0;
}